

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReshapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshape(NeuralNetworkLayer *this)

{
  ReshapeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 300) {
    clear_layer(this);
    this->_oneof_case_[0] = 300;
    this_00 = (ReshapeLayerParams *)operator_new(0x30);
    ReshapeLayerParams::ReshapeLayerParams(this_00);
    (this->layer_).reshape_ = this_00;
  }
  return (ReshapeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeLayerParams* NeuralNetworkLayer::mutable_reshape() {
  if (!has_reshape()) {
    clear_layer();
    set_has_reshape();
    layer_.reshape_ = new ::CoreML::Specification::ReshapeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshape)
  return layer_.reshape_;
}